

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::multiply(IEEEFloat *this,IEEEFloat *rhs,roundingMode rounding_mode)

{
  bool bVar1;
  lostFraction lost_fraction_00;
  opStatus local_20;
  lostFraction lost_fraction;
  opStatus fs;
  roundingMode rounding_mode_local;
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  this->field_0x12 =
       this->field_0x12 & 0xf7 |
       ((byte)this->field_0x12 >> 3 & 1 ^ (byte)rhs->field_0x12 >> 3 & 1) << 3;
  local_20 = multiplySpecials(this,rhs);
  bVar1 = isFiniteNonZero(this);
  if (bVar1) {
    lost_fraction_00 = multiplySignificand(this,rhs,(IEEEFloat *)0x0);
    local_20 = normalize(this,rounding_mode,lost_fraction_00);
    if (lost_fraction_00 != lfExactlyZero) {
      local_20 = local_20 | opInexact;
    }
  }
  return local_20;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::multiply(const IEEEFloat &rhs,
                                        roundingMode rounding_mode) {
  opStatus fs;

  sign ^= rhs.sign;
  fs = multiplySpecials(rhs);

  if (isFiniteNonZero()) {
    lostFraction lost_fraction = multiplySignificand(rhs, nullptr);
    fs = normalize(rounding_mode, lost_fraction);
    if (lost_fraction != lfExactlyZero)
      fs = (opStatus) (fs | opInexact);
  }

  return fs;
}